

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Partial.cpp
# Opt level: O2

bool __thiscall MT32Emu::Partial::canProduceOutput(Partial *this)

{
  bool bVar1;
  
  if (((-1 < this->ownerPart) && (this->alreadyOutputed == false)) &&
     (bVar1 = isRingModulatingSlave(this), !bVar1)) {
    if (this->poly != (Poly *)0x0) {
      return true;
    }
    Synth::printDebug(this->synth,
                      "[Partial %d] *** ERROR: poly is NULL at Partial::produceOutput()!",
                      (ulong)(uint)this->partialIndex);
    return false;
  }
  return false;
}

Assistant:

bool Partial::isActive() const {
	return ownerPart > -1;
}